

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeReader.cpp
# Opt level: O2

OpCode __thiscall Js::ByteCodeReader::ReadOp(ByteCodeReader *this,byte **ip,LayoutSize *layoutSize)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  OpCode OVar4;
  undefined4 *puVar5;
  byte *pbVar6;
  
  pbVar6 = *ip;
  if (this->m_endLocation <= pbVar6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeReader.cpp"
                                ,0x4f,"(ip < m_endLocation)","ip < m_endLocation");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
    pbVar6 = *ip;
  }
  *ip = pbVar6 + 1;
  bVar1 = *pbVar6;
  bVar3 = OpCodeUtil::IsPrefixOpcode((ushort)bVar1);
  if (bVar3) {
    OVar4 = ReadPrefixedOp(this,ip,layoutSize,(ushort)bVar1);
    return OVar4;
  }
  *layoutSize = SmallLayout;
  return (OpCode)bVar1;
}

Assistant:

OpCode ByteCodeReader::ReadOp(const byte *&ip, LayoutSize& layoutSize) const
    {
        // Return current location and advance past data.

        Assert(ip < m_endLocation);
        OpCode op = (OpCode)*ip++;

        if (!OpCodeUtil::IsPrefixOpcode(op))
        {
            layoutSize = SmallLayout;
            return op;
        }

        return ReadPrefixedOp(ip, layoutSize, op);
    }